

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.h
# Opt level: O0

string * __thiscall pbrt::ShapeSceneEntity::ToString_abi_cxx11_(ShapeSceneEntity *this)

{
  Transform *unaff_RBX;
  string *in_RDI;
  FileLoc *unaff_R12;
  ParameterDictionary *unaff_R14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_R15;
  char *unaff_retaddr;
  Transform *in_stack_00000040;
  int *in_stack_00000050;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000058;
  int *in_stack_00000060;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000068;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000070;
  
  StringPrintf<std::__cxx11::string_const&,pbrt::ParameterDictionary_const&,pbrt::FileLoc_const&,pbrt::Transform_const&,pbrt::Transform_const&,bool_const&,int_const&,std::__cxx11::string_const&,int_const&,std::__cxx11::string_const&,std::__cxx11::string_const&>
            (unaff_retaddr,unaff_R15,unaff_R14,unaff_R12,unaff_RBX,in_stack_00000040,(bool *)this,
             in_stack_00000050,in_stack_00000058,in_stack_00000060,in_stack_00000068,
             in_stack_00000070);
  return in_RDI;
}

Assistant:

std::string ToString() const {
        return StringPrintf(
            "[ ShapeSeneEntity name: %s parameters: %s loc: %s "
            "renderFromObject: %s objectFromRender: %s reverseOrientation: %s "
            "materialIndex: %d materialName: %s lightIndex: %d "
            "insideMedium: %s outsideMedium: %s]",
            name, parameters, loc, *renderFromObject, *objectFromRender,
            reverseOrientation, materialIndex, materialName, lightIndex, insideMedium,
            outsideMedium);
    }